

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O1

void conversion_operator_suite::get_integer(void)

{
  bool v;
  type_conflict4 tVar1;
  type_conflict8 tVar2;
  variable data;
  type local_108;
  undefined1 local_e8;
  type local_d0;
  type local_b0;
  type local_90;
  type local_70;
  type local_50;
  _Rb_tree<trial::dynamic::basic_variable<std::allocator<char>_>,_std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::_Select1st<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  local_38;
  
  local_e8 = 6;
  local_108._0_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::nullable>
            ((basic_variable<std::allocator<char>_> *)&local_108.__align);
  boost::detail::throw_failed_impl
            ("data.operator nullable()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe35,"void conversion_operator_suite::get_integer()");
  v = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_108.__align);
  boost::detail::test_impl
            ("bool(data) == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe36,"void conversion_operator_suite::get_integer()",v);
  tVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                    ((basic_variable<std::allocator<char>_> *)&local_108.__align);
  boost::detail::test_impl
            ("int(data) == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe37,"void conversion_operator_suite::get_integer()",tVar1 == 2);
  tVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                    ((basic_variable<std::allocator<char>_> *)&local_108.__align);
  boost::detail::test_impl
            ("float(data) == 2.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe38,"void conversion_operator_suite::get_integer()",(bool)(-(tVar2 == 2.0) & 1));
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::string>
            (&local_70,(basic_variable<std::allocator<char>> *)&local_108.__align);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  boost::detail::throw_failed_impl
            ("data.operator variable::string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe3b,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            (&local_90,(basic_variable<std::allocator<char>> *)&local_108.__align);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity * 4 + 4);
  }
  boost::detail::throw_failed_impl
            ("data.operator variable::wstring_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe3e,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u16string>
            (&local_b0,(basic_variable<std::allocator<char>> *)&local_108.__align);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity * 2 + 2);
  }
  boost::detail::throw_failed_impl
            ("data.operator variable::u16string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe41,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u32string>
            (&local_d0,(basic_variable<std::allocator<char>> *)&local_108.__align);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity * 4 + 4);
  }
  boost::detail::throw_failed_impl
            ("data.operator variable::u32string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe44,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
            (&local_50,(basic_variable<std::allocator<char>> *)&local_108.__align);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector(&local_50);
  boost::detail::throw_failed_impl
            ("data.operator variable::array_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe47,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
            ((type *)&local_38,(basic_variable<std::allocator<char>> *)&local_108.__align);
  std::
  _Rb_tree<trial::dynamic::basic_variable<std::allocator<char>_>,_std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::_Select1st<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_38);
  boost::detail::throw_failed_impl
            ("data.operator variable::map_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe4a,"void conversion_operator_suite::get_integer()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_108.__align);
  return;
}

Assistant:

void get_integer()
{
    variable data(2);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator nullable(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST(bool(data) == true);
    TRIAL_PROTOCOL_TEST(int(data) == 2);
    TRIAL_PROTOCOL_TEST(float(data) == 2.0f);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::wstring_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::u16string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::u32string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::array_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::map_type(),
                                    error,
                                    "incompatible type");
}